

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackGenerator::RunPreinstallTarget
          (cmCPackGenerator *this,string *installProjectName,string *installDirectory,
          cmGlobalGenerator *globalGenerator,string *buildConfig)

{
  OutputOption outputflag;
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *pcVar5;
  string local_8f8 [32];
  undefined1 local_8d8 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_760 [8];
  cmGeneratedFileStream ofs;
  allocator<char> local_4c1;
  string local_4c0;
  string *local_4a0;
  cmAlphaNum local_498;
  undefined1 local_468 [8];
  string tmpFile;
  int local_43c;
  undefined1 local_438 [3];
  bool resB;
  int retVal;
  string output;
  undefined1 local_3f8 [8];
  ostringstream cmCPackLog_msg_1;
  string local_280 [32];
  undefined1 local_260 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  string buildCommand;
  char *preinstall;
  string *buildConfig_local;
  cmGlobalGenerator *globalGenerator_local;
  string *installDirectory_local;
  string *installProjectName_local;
  cmCPackGenerator *this_local;
  
  iVar3 = (*globalGenerator->_vptr_cmGlobalGenerator[0x1d])();
  pcVar5 = (char *)CONCAT44(extraout_var,iVar3);
  if (pcVar5 != (char *)0x0) {
    buildCommand.field_2._8_8_ = pcVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar5,&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_60,globalGenerator,&local_80,buildConfig,&local_b8,&local_e0,false);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
    poVar4 = std::operator<<((ostream *)local_260,"- Install command: ");
    poVar4 = std::operator<<(poVar4,(string *)local_60);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2b2,pcVar5);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f8);
    poVar4 = std::operator<<((ostream *)local_3f8,"- Run preinstall target for: ");
    poVar4 = std::operator<<(poVar4,(string *)installProjectName);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2b5,pcVar5);
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f8);
    std::__cxx11::string::string((string *)local_438);
    local_43c = 1;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    outputflag = this->GeneratorVerbose;
    tmpFile.field_2._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar2 = cmSystemTools::RunSingleCommand
                      ((string *)local_60,(string *)local_438,(string *)local_438,&local_43c,pcVar5,
                       outputflag,(cmDuration)tmpFile.field_2._8_8_);
    if ((bVar2) && (local_43c == 0)) {
      bVar2 = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"CPACK_TOPLEVEL_DIRECTORY",&local_4c1);
      local_4a0 = (string *)GetOption(this,&local_4c0);
      cmAlphaNum::cmAlphaNum(&local_498,(cmValue)local_4a0);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&ofs.field_0x260,"/PreinstallOutput.log");
      cmStrCat<>((string *)local_468,&local_498,(cmAlphaNum *)&ofs.field_0x260);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_760,(string *)local_468,false,None);
      poVar4 = std::operator<<((ostream *)local_760,"# Run command: ");
      poVar4 = std::operator<<(poVar4,(string *)local_60);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"# Directory: ");
      poVar4 = std::operator<<(poVar4,(string *)installDirectory);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"# Output:");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,(string *)local_438);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8d8);
      poVar4 = std::operator<<((ostream *)local_8d8,"Problem running install command: ");
      poVar4 = std::operator<<(poVar4,(string *)local_60);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(poVar4,"Please check ");
      poVar4 = std::operator<<(poVar4,(string *)local_468);
      poVar4 = std::operator<<(poVar4," for errors");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x2c7,pcVar5);
      std::__cxx11::string::~string(local_8f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8d8);
      this_local._4_4_ = 0;
      bVar2 = true;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_760);
      std::__cxx11::string::~string((string *)local_468);
    }
    std::__cxx11::string::~string((string *)local_438);
    std::__cxx11::string::~string((string *)local_60);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  return 1;
}

Assistant:

int cmCPackGenerator::RunPreinstallTarget(
  const std::string& installProjectName, const std::string& installDirectory,
  cmGlobalGenerator* globalGenerator, const std::string& buildConfig)
{
  // Does this generator require pre-install?
  if (const char* preinstall = globalGenerator->GetPreinstallTargetName()) {
    std::string buildCommand = globalGenerator->GenerateCMakeBuildCommand(
      preinstall, buildConfig, "", "", false);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Install command: " << buildCommand << std::endl);
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Run preinstall target for: " << installProjectName
                                                  << std::endl);
    std::string output;
    int retVal = 1;
    bool resB = cmSystemTools::RunSingleCommand(
      buildCommand, &output, &output, &retVal, installDirectory.c_str(),
      this->GeneratorVerbose, cmDuration::zero());
    if (!resB || retVal) {
      std::string tmpFile = cmStrCat(
        this->GetOption("CPACK_TOPLEVEL_DIRECTORY"), "/PreinstallOutput.log");
      cmGeneratedFileStream ofs(tmpFile);
      ofs << "# Run command: " << buildCommand << std::endl
          << "# Directory: " << installDirectory << std::endl
          << "# Output:" << std::endl
          << output << std::endl;
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem running install command: "
                      << buildCommand << std::endl
                      << "Please check " << tmpFile << " for errors"
                      << std::endl);
      return 0;
    }
  }

  return 1;
}